

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::Postprocess_BuildNode
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiNode *pSceneNode,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pSceneMeshList,
          list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pSceneMaterialList,
          list<aiLight_*,_std::allocator<aiLight_*>_> *pSceneLightList)

{
  size_t *this_00;
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference ppCVar4;
  aiNode *this_01;
  DeadlyImportError *this_02;
  aiNode **ppaVar5;
  reference ppaVar6;
  uint *puVar7;
  reference puVar8;
  _List_const_iterator<unsigned_int> local_160;
  ulong local_158;
  size_t i_2;
  _List_const_iterator<unsigned_int> local_148;
  const_iterator it_2;
  ulong local_138;
  size_t i_1;
  _List_const_iterator<aiNode_*> local_128;
  const_iterator it_1;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  aiNode *local_b8;
  aiNode *new_node;
  const_iterator it;
  size_t i;
  CX3DImporter_NodeElement_Group *tne_group;
  undefined1 local_78 [8];
  list<unsigned_int,_std::allocator<unsigned_int>_> SceneNode_Mesh;
  list<aiNode_*,_std::allocator<aiNode_*>_> SceneNode_Child;
  const_iterator chit_end;
  const_iterator chit_begin;
  list<aiLight_*,_std::allocator<aiLight_*>_> *pSceneLightList_local;
  list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pSceneMaterialList_local;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> *pSceneMeshList_local;
  aiNode *pSceneNode_local;
  CX3DImporter_NodeElement *pNodeElement_local;
  X3DImporter *this_local;
  
  chit_end = std::__cxx11::
             list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::begin
                       (&pNodeElement->Child);
  SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size =
       (size_t)std::__cxx11::
               list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                         (&pNodeElement->Child);
  std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::list
            ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
             &SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              _M_node._M_size);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
  Postprocess_CollectMetadata(this,pNodeElement,pSceneNode);
  if ((pNodeElement->Type == ENET_Group) &&
     (memcpy(&pSceneNode->mTransformation,pNodeElement + 1,0x40),
     ((ulong)pNodeElement[1].Child.
             super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev & 0x100) != 0)) {
    if ((*(int *)((long)&pNodeElement[1].Child.
                         super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                         ._M_impl._M_node.super__List_node_base._M_prev + 4) < 0) ||
       (iVar1 = *(int *)((long)&pNodeElement[1].Child.
                                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 4),
       sVar3 = std::__cxx11::
               list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::size
                         (&pNodeElement->Child), sVar3 <= (ulong)(long)iVar1)) {
      chit_end = std::__cxx11::
                 list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                           (&pNodeElement->Child);
      SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size
           = (size_t)std::__cxx11::
                     list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
                     end(&pNodeElement->Child);
    }
    else {
      for (it._M_node = (_List_node_base *)0x0;
          it._M_node <
          (_List_node_base *)
          (long)*(int *)((long)&pNodeElement[1].Child.
                                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 4);
          it._M_node = (_List_node_base *)((long)&(it._M_node)->_M_next + 1)) {
        std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator++(&chit_end);
      }
      SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size
           = (size_t)chit_end._M_node;
      std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator++
                ((_List_const_iterator<CX3DImporter_NodeElement_*> *)
                 &SceneNode_Child.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                  _M_node._M_size);
    }
  }
  new_node = (aiNode *)chit_end._M_node;
  do {
    bVar2 = std::operator!=((_Self *)&new_node,
                            (_Self *)&SceneNode_Child.
                                      super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                                      _M_node._M_size);
    if (!bVar2) {
      bVar2 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::empty
                        ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
                         &SceneNode_Mesh.
                          super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          _M_node._M_size);
      if (!bVar2) {
        this_00 = &SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl._M_node._M_size;
        i_1 = (size_t)std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::begin
                                ((list<aiNode_*,_std::allocator<aiNode_*>_> *)this_00);
        std::_List_const_iterator<aiNode_*>::_List_const_iterator(&local_128,(iterator *)&i_1);
        sVar3 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::size
                          ((list<aiNode_*,_std::allocator<aiNode_*>_> *)this_00);
        pSceneNode->mNumChildren = (uint)sVar3;
        ppaVar5 = (aiNode **)operator_new__((ulong)pSceneNode->mNumChildren << 3);
        pSceneNode->mChildren = ppaVar5;
        for (local_138 = 0; local_138 < pSceneNode->mNumChildren; local_138 = local_138 + 1) {
          it_2._M_node = (_List_node_base *)
                         std::_List_const_iterator<aiNode_*>::operator++(&local_128,0);
          ppaVar6 = std::_List_const_iterator<aiNode_*>::operator*
                              ((_List_const_iterator<aiNode_*> *)&it_2);
          pSceneNode->mChildren[local_138] = *ppaVar6;
        }
      }
      bVar2 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        ((list<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
      if (!bVar2) {
        i_2 = (size_t)std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
        std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_148,(iterator *)&i_2);
        sVar3 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((list<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
        pSceneNode->mNumMeshes = (uint)sVar3;
        puVar7 = (uint *)operator_new__((ulong)pSceneNode->mNumMeshes << 2);
        pSceneNode->mMeshes = puVar7;
        for (local_158 = 0; local_158 < pSceneNode->mNumMeshes; local_158 = local_158 + 1) {
          local_160._M_node =
               (_List_node_base *)std::_List_const_iterator<unsigned_int>::operator++(&local_148,0);
          puVar8 = std::_List_const_iterator<unsigned_int>::operator*(&local_160);
          pSceneNode->mMeshes[local_158] = *puVar8;
        }
      }
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
      std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::~list
                ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
                 &SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl._M_node._M_size);
      return;
    }
    ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*
                        ((_List_const_iterator<CX3DImporter_NodeElement_*> *)&new_node);
    if ((*ppCVar4)->Type == ENET_Group) {
      this_01 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_01);
      local_b8 = this_01;
      ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*
                          ((_List_const_iterator<CX3DImporter_NodeElement_*> *)&new_node);
      aiString::operator=(&local_b8->mName,&(*ppCVar4)->ID);
      local_b8->mParent = pSceneNode;
      std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                ((list<aiNode_*,_std::allocator<aiNode_*>_> *)
                 &SceneNode_Mesh.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl._M_node._M_size,&local_b8);
      ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*
                          ((_List_const_iterator<CX3DImporter_NodeElement_*> *)&new_node);
      Postprocess_BuildNode
                (this,*ppCVar4,local_b8,pSceneMeshList,pSceneMaterialList,pSceneLightList);
    }
    else {
      ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*
                          ((_List_const_iterator<CX3DImporter_NodeElement_*> *)&new_node);
      if ((*ppCVar4)->Type == ENET_Shape) {
        ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*
                            ((_List_const_iterator<CX3DImporter_NodeElement_*> *)&new_node);
        Postprocess_BuildShape
                  (this,(CX3DImporter_NodeElement_Shape *)*ppCVar4,
                   (list<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,pSceneMeshList,
                   pSceneMaterialList);
      }
      else {
        ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*
                            ((_List_const_iterator<CX3DImporter_NodeElement_*> *)&new_node);
        if ((((*ppCVar4)->Type == ENET_DirectionalLight) ||
            (ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*
                                 ((_List_const_iterator<CX3DImporter_NodeElement_*> *)&new_node),
            (*ppCVar4)->Type == ENET_PointLight)) ||
           (ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*
                                ((_List_const_iterator<CX3DImporter_NodeElement_*> *)&new_node),
           (*ppCVar4)->Type == ENET_SpotLight)) {
          ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*
                              ((_List_const_iterator<CX3DImporter_NodeElement_*> *)&new_node);
          Postprocess_BuildLight(this,*ppCVar4,pSceneLightList);
        }
        else {
          ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*
                              ((_List_const_iterator<CX3DImporter_NodeElement_*> *)&new_node);
          bVar2 = PostprocessHelper_ElementIsMetadata(this,(*ppCVar4)->Type);
          if (!bVar2) {
            it_1._M_node._7_1_ = 1;
            this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            ppCVar4 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*
                                ((_List_const_iterator<CX3DImporter_NodeElement_*> *)&new_node);
            to_string<CX3DImporter_NodeElement::EType>(&local_118,(*ppCVar4)->Type);
            std::operator+(&local_f8,"Postprocess_BuildNode. Unknown type: ",&local_118);
            std::operator+(&local_d8,&local_f8,".");
            DeadlyImportError::DeadlyImportError(this_02,&local_d8);
            it_1._M_node._7_1_ = 0;
            __cxa_throw(this_02,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
        }
      }
    }
    std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator++
              ((_List_const_iterator<CX3DImporter_NodeElement_*> *)&new_node);
  } while( true );
}

Assistant:

void X3DImporter::Postprocess_BuildNode(const CX3DImporter_NodeElement& pNodeElement, aiNode& pSceneNode, std::list<aiMesh*>& pSceneMeshList,
										std::list<aiMaterial*>& pSceneMaterialList, std::list<aiLight*>& pSceneLightList) const
{
    std::list<CX3DImporter_NodeElement*>::const_iterator chit_begin = pNodeElement.Child.begin();
    std::list<CX3DImporter_NodeElement*>::const_iterator chit_end = pNodeElement.Child.end();
    std::list<aiNode*> SceneNode_Child;
    std::list<unsigned int> SceneNode_Mesh;

	// At first read all metadata
	Postprocess_CollectMetadata(pNodeElement, pSceneNode);
	// check if we have deal with grouping node. Which can contain transformation or switch
	if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Group)
	{
		const CX3DImporter_NodeElement_Group& tne_group = *((CX3DImporter_NodeElement_Group*)&pNodeElement);// create alias for convenience

		pSceneNode.mTransformation = tne_group.Transformation;
		if(tne_group.UseChoice)
		{
			// If Choice is less than zero or greater than the number of nodes in the children field, nothing is chosen.
			if((tne_group.Choice < 0) || ((size_t)tne_group.Choice >= pNodeElement.Child.size()))
			{
				chit_begin = pNodeElement.Child.end();
				chit_end = pNodeElement.Child.end();
			}
			else
			{
				for(size_t i = 0; i < (size_t)tne_group.Choice; i++) ++chit_begin;// forward iterator to chosen node.

				chit_end = chit_begin;
				++chit_end;// point end iterator to next element after chosen node.
			}
		}// if(tne_group.UseChoice)
	}// if(pNodeElement.Type == CX3DImporter_NodeElement::ENET_Group)

	// Reserve memory for fast access and check children.
	for(std::list<CX3DImporter_NodeElement*>::const_iterator it = chit_begin; it != chit_end; ++it)
	{// in this loop we do not read metadata because it's already read at begin.
		if((*it)->Type == CX3DImporter_NodeElement::ENET_Group)
		{
			// if child is group then create new node and do recursive call.
			aiNode* new_node = new aiNode;

			new_node->mName = (*it)->ID;
			new_node->mParent = &pSceneNode;
			SceneNode_Child.push_back(new_node);
			Postprocess_BuildNode(**it, *new_node, pSceneMeshList, pSceneMaterialList, pSceneLightList);
		}
		else if((*it)->Type == CX3DImporter_NodeElement::ENET_Shape)
		{
			// shape can contain only one geometry and one appearance nodes.
			Postprocess_BuildShape(*((CX3DImporter_NodeElement_Shape*)*it), SceneNode_Mesh, pSceneMeshList, pSceneMaterialList);
		}
		else if(((*it)->Type == CX3DImporter_NodeElement::ENET_DirectionalLight) || ((*it)->Type == CX3DImporter_NodeElement::ENET_PointLight) ||
				((*it)->Type == CX3DImporter_NodeElement::ENET_SpotLight))
		{
			Postprocess_BuildLight(*((CX3DImporter_NodeElement_Light*)*it), pSceneLightList);
		}
		else if(!PostprocessHelper_ElementIsMetadata((*it)->Type))// skip metadata
		{
			throw DeadlyImportError("Postprocess_BuildNode. Unknown type: " + to_string((*it)->Type) + ".");
		}
	}// for(std::list<CX3DImporter_NodeElement*>::const_iterator it = chit_begin; it != chit_end; it++)

	// copy data about children and meshes to aiNode.
	if(!SceneNode_Child.empty())
	{
		std::list<aiNode*>::const_iterator it = SceneNode_Child.begin();

		pSceneNode.mNumChildren = static_cast<unsigned int>(SceneNode_Child.size());
		pSceneNode.mChildren = new aiNode*[pSceneNode.mNumChildren];
		for(size_t i = 0; i < pSceneNode.mNumChildren; i++) pSceneNode.mChildren[i] = *it++;
	}

	if(!SceneNode_Mesh.empty())
	{
		std::list<unsigned int>::const_iterator it = SceneNode_Mesh.begin();

		pSceneNode.mNumMeshes = static_cast<unsigned int>(SceneNode_Mesh.size());
		pSceneNode.mMeshes = new unsigned int[pSceneNode.mNumMeshes];
		for(size_t i = 0; i < pSceneNode.mNumMeshes; i++) pSceneNode.mMeshes[i] = *it++;
	}

	// that's all. return to previous deals
}